

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O2

t_emit * __thiscall xemmai::t_emit::operator<<(t_emit *this,double a_operand)

{
  anon_union_8_2_f9ece6e2 anon_var_0;
  value_type local_10;
  
  local_10 = (value_type)a_operand;
  std::vector<void_*,_std::allocator<void_*>_>::push_back(&this->v_code->v_instructions,&local_10);
  return this;
}

Assistant:

t_emit& operator<<(double a_operand)
	{
		union
		{
			double v0;
			void* v1[sizeof(double) / sizeof(void*)];
		};
		v0 = a_operand;
		for (size_t i = 0; i < sizeof(double) / sizeof(void*); ++i) v_code->v_instructions.push_back(v1[i]);
		return *this;
	}